

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall
cmTestGenerator::GenerateScriptNoConfig(cmTestGenerator *this,ostream *os,Indent *indent)

{
  pointer pcVar1;
  ostream *poVar2;
  int iVar3;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if (0 < indent->Level) {
    iVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + 1;
    } while (iVar3 < indent->Level);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"add_test(",9);
  pcVar1 = (this->Test->Name)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->Test->Name)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," NOT_AVAILABLE)\n",0x10);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptNoConfig(std::ostream& os,
                                             Indent const& indent)
{
  os << indent << "add_test(" << this->Test->GetName() << " NOT_AVAILABLE)\n";
}